

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::c_formatter<spdlog::details::null_scoped_padder>::format
          (c_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  reference ppcVar1;
  const_reference ppcVar2;
  memory_buf_t *dest_00;
  string_view_t view;
  string_view_t view_00;
  char local_65 [5];
  basic_string_view<char> local_60;
  char local_49;
  basic_string_view<char> local_48;
  null_scoped_padder local_31;
  undefined8 uStack_30;
  null_scoped_padder p;
  size_t field_size;
  memory_buf_t *dest_local;
  tm *tm_time_local;
  log_msg *param_1_local;
  c_formatter<spdlog::details::null_scoped_padder> *this_local;
  
  uStack_30 = 0x18;
  dest_00 = dest;
  null_scoped_padder::null_scoped_padder(&local_31,0x18,&(this->super_flag_formatter).padinfo_,dest)
  ;
  ppcVar1 = CLI::std::array<const_char_*,_7UL>::operator[]
                      ((array<const_char_*,_7UL> *)days,(long)tm_time->tm_wday);
  ::fmt::v7::basic_string_view<char>::basic_string_view(&local_48,*ppcVar1);
  view.size_ = (size_t)dest;
  view.data_ = (char *)local_48.size_;
  fmt_helper::append_string_view((fmt_helper *)local_48.data_,view,dest_00);
  local_49 = ' ';
  ::fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,&local_49);
  ppcVar2 = CLI::std::array<const_char_*,_12UL>::operator[]
                      ((array<const_char_*,_12UL> *)months,(long)tm_time->tm_mon);
  ::fmt::v7::basic_string_view<char>::basic_string_view(&local_60,*ppcVar2);
  view_00.size_ = (size_t)dest;
  view_00.data_ = (char *)local_60.size_;
  fmt_helper::append_string_view((fmt_helper *)local_60.data_,view_00,dest_00);
  local_65[4] = 0x20;
  ::fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_65 + 4);
  fmt_helper::append_int<int>(tm_time->tm_mday,dest);
  local_65[3] = 0x20;
  ::fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_65 + 3);
  fmt_helper::pad2(tm_time->tm_hour,dest);
  local_65[2] = 0x3a;
  ::fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_65 + 2);
  fmt_helper::pad2(tm_time->tm_min,dest);
  local_65[1] = 0x3a;
  ::fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_65 + 1);
  fmt_helper::pad2(tm_time->tm_sec,dest);
  local_65[0] = ' ';
  ::fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_65);
  fmt_helper::append_int<int>(tm_time->tm_year + 0x76c,dest);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 24;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::append_string_view(days[static_cast<size_t>(tm_time.tm_wday)], dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(months[static_cast<size_t>(tm_time.tm_mon)], dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_mday, dest);
        dest.push_back(' ');
        // time

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }